

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QLayoutStruct>::clear(QList<QLayoutStruct> *this)

{
  long lVar1;
  bool bVar2;
  qsizetype qVar3;
  QPodArrayOps<QLayoutStruct> *this_00;
  __off_t __length;
  QArrayDataPointer<QLayoutStruct> *in_RDI;
  long in_FS_OFFSET;
  DataPointer detached;
  QArrayDataPointer<QLayoutStruct> *in_stack_ffffffffffffffc8;
  AllocationOption option;
  undefined1 *n;
  undefined1 *alloc;
  QArrayDataPointer<QLayoutStruct> *pQVar4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = in_RDI;
  qVar3 = size((QList<QLayoutStruct> *)in_RDI);
  option = (AllocationOption)((ulong)pQVar4 >> 0x20);
  if (qVar3 != 0) {
    QArrayDataPointer<QLayoutStruct>::operator->(in_RDI);
    bVar2 = QArrayDataPointer<QLayoutStruct>::needsDetach(in_RDI);
    if (bVar2) {
      n = &DAT_aaaaaaaaaaaaaaaa;
      alloc = &DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = (QArrayDataPointer<QLayoutStruct> *)&DAT_aaaaaaaaaaaaaaaa;
      QArrayDataPointer<QLayoutStruct>::allocatedCapacity(in_RDI);
      QArrayDataPointer<QLayoutStruct>::QArrayDataPointer
                (pQVar4,(qsizetype)alloc,(qsizetype)n,option);
      QArrayDataPointer<QLayoutStruct>::swap(in_RDI,in_stack_ffffffffffffffc8);
      QArrayDataPointer<QLayoutStruct>::~QArrayDataPointer(in_RDI);
    }
    else {
      this_00 = (QPodArrayOps<QLayoutStruct> *)QArrayDataPointer<QLayoutStruct>::operator->(in_RDI);
      QtPrivate::QPodArrayOps<QLayoutStruct>::truncate(this_00,(char *)0x0,__length);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void clear() {
        if (!size())
            return;
        if (d->needsDetach()) {
            // must allocate memory
            DataPointer detached(d.allocatedCapacity());
            d.swap(detached);
        } else {
            d->truncate(0);
        }
    }